

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBooleanElementwiseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 uVar1;
  bool bVar2;
  undefined1 auStack_38 [40];
  
  Result::Result(__return_storage_ptr__);
  uVar1 = layer->_oneof_case_[0];
  if (((uVar1 == 0x348) || (uVar1 == 0x34d)) || (uVar1 == 0x357)) {
    validateInputCount((Result *)auStack_38,layer,2,2);
  }
  else if (uVar1 == 0x352) {
    validateInputCount((Result *)auStack_38,layer,1,1);
  }
  else {
    validateInputCount((Result *)auStack_38,layer,1,2);
  }
  Result::operator=(__return_storage_ptr__,(Result *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result *)auStack_38,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)auStack_38);
    std::__cxx11::string::~string((string *)(auStack_38 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBooleanElementwiseLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalNot) {
        r = validateInputCount(layer, 1, 1);
    } else if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalAnd ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalOr ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalXor) {
        r = validateInputCount(layer, 2, 2);
    } else {
        r = validateInputCount(layer, 1, 2);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}